

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Array<double,__1,_1,_0,__1,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
_set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::Array<double,_1,1,0,_1,1>const>>
          (PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *this,
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
          *other)

{
  ActualDstType actualDst;
  assign_op<double,_double> local_9;
  
  internal::
  call_dense_assignment_loop<Eigen::Array<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::Array<double,_1,1,0,_1,1>const>,Eigen::internal::assign_op<double,double>>
            ((Array<double,__1,_1,_0,__1,_1> *)this,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>
              *)other,&local_9);
  return (Array<double,__1,_1,_0,__1,_1> *)this;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }